

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  FourCC FVar2;
  uint32_t uVar3;
  ostream *poVar4;
  Chunk ch;
  vector<char,_std::allocator<char>_> buffer;
  Chunk local_30;
  Chunk local_28;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  
  riffcpp::Chunk::Chunk(&ch,"minimal.riff");
  chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = riffcpp::Chunk::id(&ch);
  bVar1 = std::operator==((array<char,_4UL> *)&chunks,(array<char,_4UL> *)&riffcpp::riff_id);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,5);
    std::operator<<(poVar4,"): OK\n");
    chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = riffcpp::Chunk::type(&ch);
    bVar1 = std::operator==((array<char,_4UL> *)&chunks,&smpl_id);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"ch.type() == smpl_id (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,6);
      std::operator<<(poVar4,"): OK\n");
      riffcpp::Chunk::begin(&local_28,SUB81(&ch,0));
      riffcpp::Chunk::end(&local_30);
      std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
      vector<riffcpp::Chunk::iterator,void>
                ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&chunks,
                 (iterator *)&local_28,(iterator *)&local_30,(allocator_type *)&buffer);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_30);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_28);
      if ((long)chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
                super__Vector_impl_data._M_finish -
          CONCAT44(chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                   chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                   _M_impl.super__Vector_impl_data._M_start._0_4_) == 8) {
        poVar4 = std::operator<<((ostream *)&std::cout,"chunks.size() == 1 (");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
        std::operator<<(poVar4,"): OK\n");
        FVar2 = riffcpp::Chunk::id((Chunk *)CONCAT44(chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_));
        buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,FVar2._M_elems);
        bVar1 = std::operator==((array<char,_4UL> *)&buffer,&test_id);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout,"chunks[0].id() == test_id (");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,9);
          std::operator<<(poVar4,"): OK\n");
          buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          uVar3 = riffcpp::Chunk::size
                            ((Chunk *)CONCAT44(chunks.
                                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               chunks.
                                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_));
          std::vector<char,_std::allocator<char>_>::resize(&buffer,(ulong)uVar3);
          riffcpp::Chunk::read_data
                    ((Chunk *)CONCAT44(chunks.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       chunks.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_),
                     buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          if ((long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start == 1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"buffer.size() == 1 (");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xd);
            std::operator<<(poVar4,"): OK\n");
            if (*buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start == -1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xFF (");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe);
              std::operator<<(poVar4,"): OK\n");
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        (&buffer.super__Vector_base<char,_std::allocator<char>_>);
              std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector(&chunks);
              riffcpp::Chunk::~Chunk(&ch);
              return 0;
            }
            poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe);
            poVar4 = std::operator<<(poVar4,": (unsigned char)buffer[0] == 0xFF\n");
            poVar4 = std::operator<<(poVar4,"Reason: ");
            poVar4 = std::operator<<(poVar4,"Subchunk must contain \'0xFF\'");
            std::operator<<(poVar4,'\n');
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xd);
            poVar4 = std::operator<<(poVar4,": buffer.size() == 1\n");
            poVar4 = std::operator<<(poVar4,"Reason: ");
            poVar4 = std::operator<<(poVar4,"Subchunk must have data size 1");
            std::operator<<(poVar4,'\n');
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,9);
          poVar4 = std::operator<<(poVar4,": chunks[0].id() == test_id\n");
          poVar4 = std::operator<<(poVar4,"Reason: ");
          poVar4 = std::operator<<(poVar4,"Subchunk must have \'test\' id");
          std::operator<<(poVar4,'\n');
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
        poVar4 = std::operator<<(poVar4,": chunks.size() == 1\n");
        poVar4 = std::operator<<(poVar4,"Reason: ");
        poVar4 = std::operator<<(poVar4,"Toplevel chunk must contain one subchunk");
        std::operator<<(poVar4,'\n');
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,6);
      poVar4 = std::operator<<(poVar4,": ch.type() == smpl_id\n");
      poVar4 = std::operator<<(poVar4,"Reason: ");
      poVar4 = std::operator<<(poVar4,"Expected \'smpl\' chunk");
      std::operator<<(poVar4,'\n');
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,5);
    poVar4 = std::operator<<(poVar4,": ch.id() == riffcpp::riff_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Toplevel \'RIFF\' id expected");
    std::operator<<(poVar4,'\n');
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  riffcpp::Chunk ch("minimal.riff");
  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks(ch.begin(), ch.end());
  TEST_ASSERT(chunks.size() == 1, "Toplevel chunk must contain one subchunk");
  TEST_ASSERT(chunks[0].id() == test_id, "Subchunk must have 'test' id");
  std::vector<char> buffer;
  buffer.resize(chunks[0].size());
  chunks[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xFF, "Subchunk must contain '0xFF'");
}